

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int VP8Decode(VP8Decoder *dec,VP8Io *io)

{
  int iVar1;
  VP8StatusCode VVar2;
  uint uVar3;
  VP8Decoder *in_RSI;
  VP8Decoder *in_RDI;
  VP8Io *unaff_retaddr;
  VP8Decoder *in_stack_00000008;
  int ok;
  VP8Decoder *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  uint local_4;
  
  uVar4 = 0;
  if (in_RDI == (VP8Decoder *)0x0) {
    local_4 = 0;
  }
  else if (in_RSI == (VP8Decoder *)0x0) {
    local_4 = VP8SetError(in_RDI,VP8_STATUS_INVALID_PARAM,"NULL VP8Io parameter in VP8Decode().");
  }
  else if ((in_RDI->ready == 0) &&
          (iVar1 = VP8GetHeaders(in_stack_00000008,unaff_retaddr), iVar1 == 0)) {
    local_4 = 0;
  }
  else {
    VVar2 = VP8EnterCritical(in_RSI,(VP8Io *)CONCAT44(uVar4,in_stack_ffffffffffffffe0));
    local_4 = (uint)(VVar2 == VP8_STATUS_OK);
    if (local_4 != 0) {
      if (local_4 != 0) {
        local_4 = VP8InitFrame(in_stack_ffffffffffffffd8,(VP8Io *)0x10c9fb);
      }
      if (local_4 != 0) {
        local_4 = ParseFrame(in_RSI,(VP8Io *)CONCAT44(local_4,in_stack_ffffffffffffffe0));
      }
      uVar3 = VP8ExitCritical((VP8Decoder *)CONCAT44(local_4,in_stack_ffffffffffffffe0),
                              (VP8Io *)in_stack_ffffffffffffffd8);
      local_4 = uVar3 & local_4;
    }
    if (local_4 == 0) {
      VP8Clear((VP8Decoder *)0x10ca41);
      local_4 = 0;
    }
    else {
      in_RDI->ready = 0;
    }
  }
  return local_4;
}

Assistant:

int VP8Decode(VP8Decoder* const dec, VP8Io* const io) {
  int ok = 0;
  if (dec == NULL) {
    return 0;
  }
  if (io == NULL) {
    return VP8SetError(dec, VP8_STATUS_INVALID_PARAM,
                       "NULL VP8Io parameter in VP8Decode().");
  }

  if (!dec->ready) {
    if (!VP8GetHeaders(dec, io)) {
      return 0;
    }
  }
  assert(dec->ready);

  // Finish setting up the decoding parameter. Will call io->setup().
  ok = (VP8EnterCritical(dec, io) == VP8_STATUS_OK);
  if (ok) {   // good to go.
    // Will allocate memory and prepare everything.
    if (ok) ok = VP8InitFrame(dec, io);

    // Main decoding loop
    if (ok) ok = ParseFrame(dec, io);

    // Exit.
    ok &= VP8ExitCritical(dec, io);
  }

  if (!ok) {
    VP8Clear(dec);
    return 0;
  }

  dec->ready = 0;
  return ok;
}